

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O2

void __thiscall QIBusSerializable::deserializeFrom(QIBusSerializable *this,QDBusArgument *argument)

{
  QArrayDataPointer<char16_t> *this_00;
  QDBusArgumentPrivate *pQVar1;
  char cVar2;
  QDBusArgument *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_a0 [24];
  undefined8 local_88;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::operator>>(argument,(QString *)this);
  QDBusArgument::beginMap();
  this_00 = (QArrayDataPointer<char16_t> *)(local_a0 + 8);
  while( true ) {
    cVar2 = QDBusArgument::atEnd();
    if (cVar2 != '\0') break;
    QDBusArgument::beginMapEntry();
    local_a0._8_8_ = 0;
    local_a0._16_8_ = 0;
    local_88 = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QDBusArgument::operator>>(argument,(QString *)this_00);
    QDBusArgument::operator>>(argument,(QDBusVariant *)&local_58);
    QDBusArgument::endMapEntry();
    QVariant::QVariant(&local_78,(QVariant *)&local_58);
    qvariant_cast<QDBusArgument>((QVariant *)local_a0);
    pQVar3 = QHash<QString,_QDBusArgument>::operator[](&this->attachments,(QString *)this_00);
    pQVar1 = pQVar3->d;
    pQVar3->d = (QDBusArgumentPrivate *)local_a0._0_8_;
    local_a0._0_8_ = pQVar1;
    QDBusArgument::~QDBusArgument((QDBusArgument *)local_a0);
    QVariant::~QVariant(&local_78);
    QVariant::~QVariant((QVariant *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  }
  QDBusArgument::endMap();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusSerializable::deserializeFrom(const QDBusArgument &argument)
{
    argument >> name;

    argument.beginMap();
    while (!argument.atEnd()) {
        argument.beginMapEntry();
        QString key;
        QDBusVariant value;
        argument >> key;
        argument >> value;
        argument.endMapEntry();
        attachments[key] = qvariant_cast<QDBusArgument>(value.variant());
    }
    argument.endMap();
}